

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O1

void cal_dataReady(stringstream *st)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  pointer pGVar4;
  float *pfVar5;
  istream *piVar6;
  istream *piVar7;
  mapped_type *pmVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int tmpNum;
  int planeTypeNum;
  int ifFighterOnly;
  int tmpAvailBit;
  int leastAttackerSz;
  string tmpName;
  int local_84;
  stringstream *local_80;
  Grid local_74;
  int local_5c;
  uint local_58;
  int local_54;
  key_type local_50;
  
  pfVar5 = (float *)std::istream::operator>>((istream *)st,&tarAirSupremacy);
  piVar6 = std::istream::_M_extract<float>(pfVar5);
  piVar6 = std::istream::_M_extract<float>((float *)piVar6);
  piVar7 = (istream *)std::istream::operator>>((istream *)piVar6,&local_54);
  piVar7 = (istream *)std::istream::operator>>(piVar7,&armor);
  std::istream::operator>>(piVar7,&nearing_coef);
  armor_max = (int)((double)armor * 1.3333333333333333);
  armor_min = (int)((double)armor * 0.6666666666666666);
  local_80 = st;
  std::istream::operator>>((istream *)st,&carrierNum);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (0 < carrierNum) {
    lVar12 = 0;
    do {
      piVar6 = std::operator>>((istream *)local_80,(string *)&local_50);
      piVar7 = (istream *)std::istream::operator>>((istream *)piVar6,(int *)&local_58);
      std::istream::operator>>(piVar7,&local_5c);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&carriers_m_abi_cxx11_,&local_50);
      iVar10 = *pmVar8;
      uVar1 = carriers.super__Vector_base<Carrier,_std::allocator<Carrier>_>._M_impl.
              super__Vector_impl_data._M_start[iVar10].gridNum;
      std::vector<Carrier,_std::allocator<Carrier>_>::push_back
                (&theCarrier,
                 carriers.super__Vector_base<Carrier,_std::allocator<Carrier>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar10);
      availGrid[lVar12] = 0;
      if (0 < (int)uVar1) {
        uVar9 = 1 << (4U - (char)uVar1 & 0x1f);
        uVar14 = (ulong)uVar1;
        do {
          if ((local_58 & uVar9) != 0) {
            local_74.gridSize =
                 carriers.super__Vector_base<Carrier,_std::allocator<Carrier>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar10].gridSize[uVar14 - 1];
            local_74.gridSizeFsb =
                 (int)((double)local_74.gridSize *
                      *(double *)(&DAT_0010d1d0 + (ulong)(uVar14 == 1) * 8));
            local_74.carrierAtk =
                 carriers.super__Vector_base<Carrier,_std::allocator<Carrier>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar10].atk;
            bVar11 = local_74.gridSize < local_54 || local_5c != 0;
            local_74.carrierPos = (int)lVar12;
            local_74.gridPos = (int)uVar14 + -1;
            local_74.isFighterOnly = (int)bVar11;
            if (gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Grid,_std::allocator<Grid>_>::_M_realloc_insert<Grid>
                        (&gridVec,(iterator)
                                  gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                                  super__Vector_impl_data._M_finish,&local_74);
            }
            else {
              uVar3 = (ulong)CONCAT14(bVar11,local_74.carrierAtk);
              pGVar4 = gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pGVar4->carrierAtk = (int)uVar3;
              pGVar4->isFighterOnly = (int)(uVar3 >> 0x20);
              pGVar4->carrierPos = local_74.carrierPos;
              pGVar4->gridPos = local_74.gridPos;
              pGVar4->gridSize = local_74.gridSize;
              pGVar4->gridSizeFsb = local_74.gridSizeFsb;
              gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].isFighterOnly == 0) {
              availGrid[lVar12] = availGrid[lVar12] + 1;
              attackerAbleGridNum = attackerAbleGridNum + 1;
            }
          }
          uVar9 = uVar9 * 2;
          bVar11 = 1 < (long)uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar11);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < carrierNum);
  }
  std::istream::operator>>((istream *)local_80,&local_74.carrierPos);
  if (0 < local_74.carrierPos) {
    iVar10 = 0;
    do {
      std::operator>>((istream *)local_80,(string *)&local_50);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&planes_m_abi_cxx11_,&local_50);
      iVar2 = *pmVar8;
      std::istream::operator>>((istream *)local_80,&local_84);
      if (0 < local_84) {
        iVar13 = 0;
        do {
          std::vector<Plane,_std::allocator<Plane>_>::push_back
                    (&planeVec,
                     planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar2);
          iVar13 = iVar13 + 1;
        } while (iVar13 < local_84);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < local_74.carrierPos);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void cal_dataReady(stringstream &st){//��query������Ҫ����
    int leastAttackerSz;
    st>>tarAirSupremacy>>op_coef>>accu_coef>>leastAttackerSz>>armor>>nearing_coef;

    armor_max=armor*(4.0/3);
    armor_min=armor*(2.0/3);
    //read carrier
    st>>carrierNum;
    string tmpName;
    int tmpAvailBit,ifFighterOnly;
    for(int i=0;i<carrierNum;i++){
        st>>tmpName>>tmpAvailBit>>ifFighterOnly;
        int tmpCarrierID=carriers_m[tmpName];
        int tmpCarrierGridNum=carriers[tmpCarrierID].gridNum;
        theCarrier.push_back(carriers[tmpCarrierID]);
        int bit=1<<(4-tmpCarrierGridNum);
        //insert grid
        availGrid[i]=0;

        for(int j=tmpCarrierGridNum-1;j>=0;j--){
            if(tmpAvailBit&bit){//bit arithmatic judge if the grid available
                int &tmpGridSize=carriers[tmpCarrierID].gridSize[j];
                gridVec.push_back(Grid(i,j,tmpGridSize, tmpGridSize*(j==0?FIRST_SLOT_BUFF:1),carriers[tmpCarrierID].atk,checkIfFighterOnly(tmpGridSize,leastAttackerSz,ifFighterOnly)));
                if(!gridVec.back().isFighterOnly){
                    availGrid[i]++;
                    attackerAbleGridNum++;
                }
            }
            bit<<=1;
        }
    }

    //read plane
    int planeTypeNum;
    st>>planeTypeNum;
    for(int i=0;i<planeTypeNum;i++){
        st>>tmpName;
        int tmpPlaneID=planes_m[tmpName];
        int tmpNum;
        st>>tmpNum;
        for(int i=0;i<tmpNum;i++)
            planeVec.push_back(planes[tmpPlaneID]);
    }
}